

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr __n;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar3;
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  _Alloc_hider _Var9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  _Base_ptr p_Var12;
  ulong uVar13;
  char *__s;
  ostream *poVar14;
  _Rb_tree_node_base *p_Var15;
  string *name;
  pointer __k;
  char *pcVar16;
  Message errors;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_d8;
  TypedTestCasePState *local_b8;
  uint local_ac;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  internal *local_60;
  char *local_58;
  string local_50;
  
  *this = (TypedTestCasePState)0x1;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = registered_tests + -1;
  local_b8 = this;
  local_ac = line;
  local_60 = (internal *)file;
  local_58 = registered_tests;
  do {
    pbVar1 = (byte *)(__s + 1);
    __s = __s + 1;
    iVar5 = isspace((uint)*pbVar1);
  } while (iVar5 != 0);
  do {
    pcVar7 = strchr(__s,0x2c);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    if (pcVar7 == (char *)0x0) {
      sVar8 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,__s,__s + sVar8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,__s,pcVar7);
    }
    _Var9._M_p = local_d8._M_dataplus._M_p;
    if (local_d8._M_string_length != 0) {
      pcVar7 = local_d8._M_dataplus._M_p + local_d8._M_string_length;
      do {
        _Var4._M_p = local_d8._M_dataplus._M_p;
        iVar5 = isspace((uint)(byte)pcVar7[-1]);
        _Var9._M_p = _Var4._M_p;
        if (iVar5 == 0) break;
        pcVar16 = pcVar7 + -1;
        uVar13 = (long)pcVar16 - (long)_Var4._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_d8,uVar13);
        pcVar7 = local_d8._M_dataplus._M_p + uVar13;
        _Var9._M_p = local_d8._M_dataplus._M_p;
      } while (pcVar16 != _Var4._M_p);
    }
    paVar2 = &local_d8.field_2;
    local_a8._0_8_ = _Var9._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar2) {
      local_a8._24_8_ = local_d8.field_2._8_8_;
      local_a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_a8 + 0x10);
    }
    local_a8._17_7_ = local_d8.field_2._M_allocated_capacity._1_7_;
    local_a8[0x10] = local_d8.field_2._M_local_buf[0];
    local_a8._8_8_ = local_d8._M_string_length;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    __s = strchr(__s,0x2c);
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(__s + 1);
        __s = __s + 1;
        iVar5 = isspace((uint)*pbVar1);
      } while (iVar5 != 0);
    }
  } while (__s != (char *)0x0);
  Message::Message((Message *)&local_e0);
  p_Var12 = (_Base_ptr)(local_a8 + 8);
  local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
  local_a8._16_8_ = 0;
  local_80 = 0;
  local_a8._24_8_ = p_Var12;
  local_88 = p_Var12;
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar14 = (ostream *)(local_e0.ptr_ + 0x10);
    p_Var11 = (_Rb_tree_node_base *)(local_b8 + 0x10);
    __k = local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a8,__k);
      p_Var12 = (_Base_ptr)(local_a8 + 8);
      if (cVar10._M_node == p_Var12) {
        p_Var15 = *(_Rb_tree_node_base **)(local_b8 + 0x20);
        if (p_Var15 != p_Var11) {
          __n = (_Base_ptr)__k->_M_string_length;
          do {
            if ((__n == p_Var15[1]._M_parent) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar5 = bcmp((__k->_M_dataplus)._M_p,*(void **)(p_Var15 + 1),(size_t)__n),
                iVar5 == 0)))) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_a8,__k);
              goto LAB_00123409;
            }
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
          } while (p_Var15 != p_Var11);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"No test named ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," can be found in this test case.\n",0x21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Test ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(__k->_M_dataplus)._M_p,__k->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," is listed more than once.\n",0x1b);
      }
LAB_00123409:
      __k = __k + 1;
    } while (__k != local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar5 = (int)p_Var12;
  p_Var11 = *(_Rb_tree_node_base **)(local_b8 + 0x20);
  p_Var15 = (_Rb_tree_node_base *)(local_b8 + 0x10);
  if (p_Var11 != p_Var15) {
    do {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a8,(key_type *)(p_Var11 + 1));
      p_Var12 = (_Base_ptr)(local_a8 + 8);
      if (cVar10._M_node == p_Var12) {
        poVar14 = (ostream *)(local_e0.ptr_ + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,".\n",2);
      }
      iVar5 = (int)p_Var12;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var15);
  }
  sVar3.ptr_ = local_e0.ptr_;
  StringStreamToString(&local_d8,local_e0.ptr_);
  iVar6 = std::__cxx11::string::compare((char *)&local_d8);
  if (iVar6 != 0) {
    FormatFileLocation_abi_cxx11_(&local_50,local_60,(char *)(ulong)local_ac,iVar5);
    VerifyRegisteredTestNames();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
    if (local_e0.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_e0.ptr_ + 8))();
      local_e0.ptr_ = (stringstream *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    _Unwind_Resume(extraout_RAX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  if (sVar3.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)sVar3.ptr_ + 8))(sVar3.ptr_);
    local_e0.ptr_ = (stringstream *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return local_58;
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}